

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void WrapLine(TidyDocImpl *doc)

{
  uint *puVar1;
  Bool BVar2;
  ulong uVar3;
  
  if ((doc->pprint).wraphere != 0) {
    BVar2 = WantIndent(doc);
    if (BVar2 != no) {
      WriteIndentChar(doc);
    }
    for (uVar3 = 0; uVar3 < (doc->pprint).wraphere; uVar3 = uVar3 + 1) {
      prvTidyWriteChar((doc->pprint).linebuf[uVar3],doc->docOut);
    }
    BVar2 = IsWrapInString(&doc->pprint);
    if (BVar2 != no) {
      prvTidyWriteChar(0x5c,doc->docOut);
    }
    prvTidyWriteChar(10,doc->docOut);
    puVar1 = &(doc->pprint).line;
    *puVar1 = *puVar1 + 1;
    ResetLineAfterWrap(&doc->pprint);
    return;
  }
  return;
}

Assistant:

static void WrapLine( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;

    if ( pprint->wraphere == 0 )
        return;

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->wraphere; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsWrapInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );

    TY_(WriteChar)( '\n', doc->docOut );
    pprint->line++;
    ResetLineAfterWrap( pprint );
}